

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_String.cc
# Opt level: O0

ssize_t __thiscall Pl_String::write(Pl_String *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  pointer pMVar2;
  Pl_String *pPVar3;
  Pipeline *pPVar4;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_t len_local;
  uchar *buf_local;
  Pl_String *this_local;
  
  pPVar3 = this;
  if (__buf != (void *)0x0) {
    pMVar2 = std::unique_ptr<Pl_String::Members,_std::default_delete<Pl_String::Members>_>::
             operator->(&this->m);
    std::__cxx11::string::append((char *)pMVar2->s,CONCAT44(in_register_00000034,__fd));
    pPVar3 = (Pl_String *)Pipeline::next(&this->super_Pipeline);
    if (pPVar3 != (Pl_String *)0x0) {
      pPVar4 = Pipeline::next(&this->super_Pipeline);
      iVar1 = (*pPVar4->_vptr_Pipeline[2])(pPVar4,CONCAT44(in_register_00000034,__fd),__buf);
      pPVar3 = (Pl_String *)CONCAT44(extraout_var,iVar1);
    }
  }
  return (ssize_t)pPVar3;
}

Assistant:

void
Pl_String::write(unsigned char const* buf, size_t len)
{
    if (!len) {
        return;
    }
    m->s.append(reinterpret_cast<char const*>(buf), len);
    if (next()) {
        next()->write(buf, len);
    }
}